

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O1

void __thiscall Win32MakefileGenerator::writeLibsPart(Win32MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  Data *pDVar2;
  bool bVar3;
  bool bVar4;
  QTextStream *pQVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QStringView config;
  ProKey local_218;
  QArrayDataPointer<ProString> local_1e8;
  QString local_1d0;
  ProKey local_1b8;
  QArrayDataPointer<ProString> local_188;
  QString local_170;
  ProKey local_158;
  QArrayDataPointer<ProString> local_128;
  QString local_110;
  QArrayDataPointer<ProString> local_f8;
  QString local_e0;
  ProKey local_c8;
  ProKey local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_MakefileGenerator).project;
  QVar6.m_data = (storage_type *)0x9;
  QVar6.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar6);
  pDVar2 = local_68.m_string.d.d;
  bVar4 = false;
  config.m_data = local_68.m_string.d.ptr;
  config.m_size = local_68.m_string.d.size;
  bVar3 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
  if (bVar3) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_98,"TEMPLATE");
    QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,&local_98);
    bVar4 = ProString::operator==(&local_68,"lib");
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
    }
  }
  if (bVar4 == false) {
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"LINKER        = ");
    ProKey::ProKey(&local_c8,"QMAKE_LINK");
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (&local_158,this,&local_c8);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_158);
    Qt::endl(pQVar5);
    if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"LFLAGS        = ");
    ProKey::ProKey(&local_c8,"QMAKE_LFLAGS");
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (&local_158,this,&local_c8);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_158);
    Qt::endl(pQVar5);
    if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"LIBS          = ");
    ProKey::ProKey(&local_c8,"LIBS");
    MakefileGenerator::fixLibFlags
              ((ProStringList *)&local_f8,&this->super_MakefileGenerator,&local_c8);
    ProStringList::join(&local_e0,(ProStringList *)&local_f8,(QChar)0x20);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_e0);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,' ');
    ProKey::ProKey(&local_158,"LIBS_PRIVATE");
    MakefileGenerator::fixLibFlags
              ((ProStringList *)&local_128,&this->super_MakefileGenerator,&local_158);
    ProStringList::join(&local_110,(ProStringList *)&local_128,(QChar)0x20);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_110);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,' ');
    ProKey::ProKey(&local_1b8,"QMAKE_LIBS");
    MakefileGenerator::fixLibFlags
              ((ProStringList *)&local_188,&this->super_MakefileGenerator,&local_1b8);
    ProStringList::join(&local_170,(ProStringList *)&local_188,(QChar)0x20);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_170);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,' ');
    ProKey::ProKey(&local_218,"QMAKE_LIBS_PRIVATE");
    MakefileGenerator::fixLibFlags
              ((ProStringList *)&local_1e8,&this->super_MakefileGenerator,&local_218);
    ProStringList::join(&local_1d0,(ProStringList *)&local_1e8,(QChar)0x20);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_1d0);
    Qt::endl(pQVar5);
    if (&(local_1d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1d0.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_1e8);
    if (&(local_218.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_218.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_218.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_218.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_218.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_170.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_170.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_188);
    if (&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_110.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_110.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_110.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_128);
    if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_f8);
  }
  else {
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"LIBAPP        = ");
    ProKey::ProKey(&local_c8,"QMAKE_LIB");
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (&local_158,this,&local_c8);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_158);
    Qt::endl(pQVar5);
    if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar5 = (QTextStream *)QTextStream::operator<<(t,"LIBFLAGS      = ");
    ProKey::ProKey(&local_c8,"QMAKE_LIBFLAGS");
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (&local_158,this,&local_c8);
    pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&local_158);
    Qt::endl(pQVar5);
    if (&(local_158.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_158.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_158.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Win32MakefileGenerator::writeLibsPart(QTextStream &t)
{
    if(project->isActiveConfig("staticlib") && project->first("TEMPLATE") == "lib") {
        t << "LIBAPP        = " << var("QMAKE_LIB") << Qt::endl;
        t << "LIBFLAGS      = " << var("QMAKE_LIBFLAGS") << Qt::endl;
    } else {
        t << "LINKER        = " << var("QMAKE_LINK") << Qt::endl;
        t << "LFLAGS        = " << var("QMAKE_LFLAGS") << Qt::endl;
        t << "LIBS          = " << fixLibFlags("LIBS").join(' ') << ' '
                                << fixLibFlags("LIBS_PRIVATE").join(' ') << ' '
                                << fixLibFlags("QMAKE_LIBS").join(' ') << ' '
                                << fixLibFlags("QMAKE_LIBS_PRIVATE").join(' ') << Qt::endl;
    }
}